

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O0

void wabt::RenameToIdentifiers<wabt::Event>
               (vector<wabt::Event_*,_std::allocator<wabt::Event_*>_> *things,BindingHash *bh,
               set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
               *filter)

{
  bool bVar1;
  reference ppEVar2;
  Event *thing;
  iterator __end0;
  iterator __begin0;
  vector<wabt::Event_*,_std::allocator<wabt::Event_*>_> *__range2;
  Index i;
  set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
  *filter_local;
  BindingHash *bh_local;
  vector<wabt::Event_*,_std::allocator<wabt::Event_*>_> *things_local;
  
  __range2._4_4_ = 0;
  __end0 = std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::begin(things);
  thing = (Event *)std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::end(things);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<wabt::Event_**,_std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>_>
                                *)&thing);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<wabt::Event_**,_std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>_>
              ::operator*(&__end0);
    RenameToIdentifier(&(*ppEVar2)->name,__range2._4_4_,bh,filter);
    __gnu_cxx::
    __normal_iterator<wabt::Event_**,_std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>_>::
    operator++(&__end0);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  return;
}

Assistant:

void RenameToIdentifiers(std::vector<T*>& things, BindingHash& bh,
                         const std::set<string_view>* filter) {
  Index i = 0;
  for (auto thing : things) {
    RenameToIdentifier(thing->name, i++, bh, filter);
  }
}